

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::Petition
          (CommissionerImpl *this,PetitionHandler *aHandler,string *aAddr,uint16_t aPort)

{
  bool bVar1;
  uint uVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  Error local_328;
  ErrorCode local_2fc;
  function<void_(ot::commissioner::Error)> local_2f8;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  local_2d8;
  anon_class_1_0_00000001 local_2b2;
  v10 local_2b1;
  v10 *local_2b0;
  char *local_2a8;
  string local_2a0;
  allocator local_279;
  string local_278;
  anon_class_1_0_00000001 local_252;
  v10 local_251;
  v10 *local_250;
  size_t local_248;
  string local_240;
  Error local_220;
  undefined1 local_1e8 [8];
  anon_class_40_2_3adf01b8 onConnected;
  Error error;
  uint16_t aPort_local;
  string *aAddr_local;
  PetitionHandler *aHandler_local;
  CommissionerImpl *this_local;
  undefined1 local_160 [16];
  v10 *local_150;
  ulong local_148;
  v10 *local_140;
  size_t sStack_138;
  string *local_130;
  v10 *local_128;
  v10 **local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  local_118;
  undefined1 local_f8 [16];
  v10 *local_e8;
  char *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  string *local_d0;
  v10 *local_c8;
  char *pcStack_c0;
  string *local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  CommissionerImpl **local_80;
  undefined1 *local_78;
  CommissionerImpl **local_70;
  undefined8 local_68;
  undefined1 *local_60;
  CommissionerImpl **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  *local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  *local_10;
  
  error.mMessage.field_2._14_2_ = aPort;
  Error::Error((Error *)&onConnected.this);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
              *)local_1e8,aHandler);
  onConnected.aHandler._M_invoker = (_Invoker_type)this;
  uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_278,"meshcop",&local_279);
    Petition::anon_class_1_0_00000001::operator()(&local_2b2);
    local_a8 = &local_2b0;
    local_b0 = &local_2b1;
    bVar3 = ::fmt::v10::operator()(local_b0);
    local_2a8 = (char *)bVar3.size_;
    local_2b0 = (v10 *)bVar3.data_;
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short_&,_FMT_COMPILE_STRING,_0>
              ();
    local_b8 = &local_2a0;
    local_c8 = local_2b0;
    pcStack_c0 = local_2a8;
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&error.mMessage.field_2 + 0xe);
    local_50 = &local_c8;
    local_e8 = local_2b0;
    local_e0 = local_2a8;
    local_d0 = aAddr;
    local_48 = local_e8;
    pcStack_40 = local_e0;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const,unsigned_short>
              (&local_118,(v10 *)aAddr,local_d8,(unsigned_short *)local_2b0);
    local_30 = local_f8;
    local_38 = &local_118;
    local_20 = 0x2d;
    fmt_00.size_ = 0x2d;
    fmt_00.data_ = local_e0;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_2a0,local_e8,fmt_00,args_00);
    Log(kDebug,&local_278,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    bVar1 = coap::CoapSecure::IsConnected(&this->mBrClient);
    if (bVar1) {
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
      ::function(&local_2d8,aHandler);
      SendPetition(this,&local_2d8);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
      ::~function(&local_2d8);
    }
    else {
      std::function<void(ot::commissioner::Error)>::
      function<ot::commissioner::CommissionerImpl::Petition(std::function<void(std::__cxx11::string_const*,ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)::__0&,void>
                ((function<void(ot::commissioner::Error)> *)&local_2f8,
                 (anon_class_40_2_3adf01b8 *)local_1e8);
      (*(this->super_Commissioner)._vptr_Commissioner[4])
                (this,&local_2f8,aAddr,(ulong)(ushort)error.mMessage.field_2._14_2_);
      std::function<void_(ot::commissioner::Error)>::~function(&local_2f8);
    }
  }
  else {
    Petition::anon_class_1_0_00000001::operator()(&local_252);
    local_120 = &local_250;
    local_128 = &local_251;
    bVar3 = ::fmt::v10::operator()(local_128);
    local_248 = bVar3.size_;
    local_250 = (v10 *)bVar3.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_130 = &local_240;
    local_140 = local_250;
    sStack_138 = local_248;
    local_a0 = &local_140;
    local_150 = local_250;
    local_148 = local_248;
    local_98 = local_150;
    sStack_90 = local_148;
    this_local = (CommissionerImpl *)
                 ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_78 = local_160;
    local_80 = &this_local;
    local_68 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_148;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_80;
    local_70 = local_80;
    local_60 = local_78;
    local_58 = local_80;
    ::fmt::v10::vformat_abi_cxx11_(&local_240,local_150,fmt,args);
    Error::Error(&local_220,kInvalidState,&local_240);
    Error::operator=((Error *)&onConnected.this,&local_220);
    Error::~Error(&local_220);
    std::__cxx11::string::~string((string *)&local_240);
  }
  local_2fc = kNone;
  bVar1 = commissioner::operator!=((Error *)&onConnected.this,&local_2fc);
  if (bVar1) {
    Error::Error(&local_328,(Error *)&onConnected.this);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
    ::operator()(aHandler,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0,
                 &local_328);
    Error::~Error(&local_328);
  }
  Petition(std::function<void(std::__cxx11::string_const*,ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)
  ::$_0::~__0((__0 *)local_1e8);
  Error::~Error((Error *)&onConnected.this);
  return;
}

Assistant:

void CommissionerImpl::Petition(PetitionHandler aHandler, const std::string &aAddr, uint16_t aPort)
{
    Error error;

    auto onConnected = [&, aHandler](Error aError) {
        if (aError != ErrorCode::kNone)
        {
            aHandler(nullptr, aError);
        }
        else
        {
            LOG_DEBUG(LOG_REGION_MESHCOP, "DTLS connection to border agent succeed");
            this->mState = State::kConnected;
            SendPetition(aHandler);
        }
    };

    VerifyOrExit(!IsActive(), error = ERROR_INVALID_STATE("cannot petition when the commissioner is running"));
    LOG_DEBUG(LOG_REGION_MESHCOP, "starting petition: border agent = ({}, {})", aAddr, aPort);

    if (mBrClient.IsConnected())
    {
        SendPetition(aHandler);
    }
    else
    {
        Connect(onConnected, aAddr, aPort);
    }

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}